

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

bool __thiscall asl::Socket_::waitInput(Socket_ *this,double t)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  fd_set *__arr;
  undefined1 auStack_b8 [4];
  uint __i;
  timeval to;
  fd_set rset;
  int a;
  double t_local;
  Socket_ *this_local;
  
  if (*(int *)&(this->super_SmartObject_).field_0xc < 0) {
    this_local._7_1_ = false;
  }
  else {
    iVar2 = (*(this->super_SmartObject_)._vptr_SmartObject_[0xc])();
    if (iVar2 < 1) {
      if (iVar2 < 0) {
        this->_error = 6;
        this_local._7_1_ = true;
      }
      else {
        dVar4 = floor(t);
        _auStack_b8 = (long)(int)dVar4;
        dVar4 = floor(t);
        to.tv_sec = (__time_t)(int)((t - dVar4) * 1000000.0);
        for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
          rset.fds_bits[(ulong)__arr._4_4_ - 1] = 0;
        }
        iVar2 = (*(this->super_SmartObject_)._vptr_SmartObject_[4])();
        iVar3 = (*(this->super_SmartObject_)._vptr_SmartObject_[4])();
        rset.fds_bits[(long)(iVar3 / 0x40) + -1] =
             1L << ((byte)((long)iVar2 % 0x40) & 0x3f) | rset.fds_bits[(long)(iVar3 / 0x40) + -1];
        iVar2 = (*(this->super_SmartObject_)._vptr_SmartObject_[4])
                          (this,0x40,(long)iVar3 % 0x40 & 0xffffffff);
        iVar2 = select(iVar2 + 1,(fd_set *)&to.tv_usec,(fd_set *)0x0,(fd_set *)0x0,
                       (timeval *)auStack_b8);
        if (iVar2 < 0) {
          this->_error = 7;
          this_local._7_1_ = true;
        }
        else {
          iVar2 = (*(this->super_SmartObject_)._vptr_SmartObject_[4])();
          uVar1 = rset.fds_bits[(long)(iVar2 / 0x40) + -1];
          iVar2 = (*(this->super_SmartObject_)._vptr_SmartObject_[4])();
          this_local._7_1_ = (uVar1 & 1L << ((byte)((long)iVar2 % 0x40) & 0x3f)) != 0;
        }
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Socket_::waitInput(double t)
{
	if (_handle < 0)
		return false;
	int a = available();
	if (a > 0)
		return true;
	if (a < 0)
	{
		_error = SOCKET_BAD_DATA;
		return true;
	}
	fd_set rset;
	timeval to;
	to.tv_sec = (int)floor(t);
	to.tv_usec = (int)((t-floor(t))*1e6);
	FD_ZERO(&rset);
	FD_SET(handle(), &rset);
	if(select(handle()+1, &rset, 0, 0, &to) >= 0)
		return FD_ISSET(handle(), &rset)!=0;
	_error = SOCKET_BAD_WAIT;
	return true;
}